

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_compress.c
# Opt level: O0

void deflate_flush_block(libdeflate_compressor *c,deflate_output_bitstream *os,u8 *block_begin,
                        u32 block_length,deflate_sequence *sequences,_Bool is_final_block)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  ulong *puVar9;
  byte bVar10;
  uint in_ECX;
  byte *pbVar11;
  byte *pbVar12;
  byte *in_RDX;
  ulong *in_RSI;
  libdeflate_compressor *in_RDI;
  uint *in_R8;
  byte in_R9B;
  uint offset_slot___1;
  u32 offset___1;
  u32 length___1;
  deflate_codes *codes___1;
  libdeflate_compressor *c___1;
  uint lit;
  u32 length_1;
  u32 litrunlen;
  deflate_sequence *seq;
  uint offset_slot__;
  u32 offset__;
  u32 length__;
  deflate_codes *codes__;
  libdeflate_compressor *c__;
  u32 offset;
  u32 length;
  deflate_optimum_node *end_node;
  deflate_optimum_node *cur_node;
  uint i;
  uint precode_item;
  uint precode_sym;
  uint num_precode_items;
  uint num_explicit_lens;
  size_t len;
  u8 bfinal;
  u32 extra_2;
  u32 extra_1;
  u32 extra;
  uint sym;
  deflate_codes *codes;
  u32 best_cost;
  u32 uncompressed_cost;
  u32 static_cost;
  u32 dynamic_cost;
  u8 *out_fast_end;
  u8 *out_next;
  uint bitcount;
  bitbuf_t bitbuf;
  u8 *in_end;
  u8 *in_next;
  uint local_368;
  uint local_364;
  uint local_360;
  long local_350;
  uint local_314;
  uint *local_310;
  undefined1 *local_2d8;
  uint local_2cc;
  size_t local_2b8;
  byte local_2a9;
  uint local_29c;
  deflate_codes *local_298;
  uint local_288;
  uint local_284;
  ulong *local_278;
  uint local_26c;
  ulong local_268;
  byte *local_258;
  
  bVar1 = in_R9B & 1;
  pbVar8 = in_RDX + in_ECX;
  local_268 = *in_RSI;
  local_26c = (uint)in_RSI[1];
  local_278 = (ulong *)in_RSI[2];
  if ((long)(in_RSI[3] - (long)local_278) < 7) {
    local_350 = in_RSI[3] - (long)local_278;
  }
  else {
    local_350 = 7;
  }
  puVar9 = (ulong *)(in_RSI[3] - local_350);
  local_288 = 3;
  deflate_precompute_huffman_header((libdeflate_compressor *)0x1149fd);
  local_284 = (in_RDI->o).precode.num_explicit_lens * 3 + 0x11;
  for (local_29c = 0; local_29c < 0x13; local_29c = local_29c + 1) {
    local_284 = *(int *)((long)&in_RDI->o + (ulong)local_29c * 4) *
                ((uint)""[local_29c] + (uint)*(byte *)((long)&in_RDI->o + (ulong)local_29c + 0x98))
                + local_284;
  }
  for (local_29c = 0; local_29c < 0x90; local_29c = local_29c + 1) {
    local_284 = (in_RDI->freqs).litlen[local_29c] * (uint)(in_RDI->codes).lens.litlen[local_29c] +
                local_284;
    local_288 = (in_RDI->freqs).litlen[local_29c] * 8 + local_288;
  }
  for (; local_29c < 0x100; local_29c = local_29c + 1) {
    local_284 = (in_RDI->freqs).litlen[local_29c] * (uint)(in_RDI->codes).lens.litlen[local_29c] +
                local_284;
    local_288 = (in_RDI->freqs).litlen[local_29c] * 9 + local_288;
  }
  local_284 = (in_RDI->codes).lens.litlen[0x100] + local_284;
  local_288 = local_288 + 7;
  for (local_29c = 0x101; local_29c < 0x11e; local_29c = local_29c + 1) {
    local_284 = (in_RDI->freqs).litlen[local_29c] *
                ((uint)""[local_29c - 0x101] + (uint)(in_RDI->codes).lens.litlen[local_29c]) +
                local_284;
    local_288 = (in_RDI->freqs).litlen[local_29c] *
                ((uint)""[local_29c - 0x101] + (uint)(in_RDI->static_codes).lens.litlen[local_29c])
                + local_288;
  }
  for (local_29c = 0; local_29c < 0x1e; local_29c = local_29c + 1) {
    local_284 = (in_RDI->freqs).offset[local_29c] *
                ((uint)""[local_29c] + (uint)(in_RDI->codes).lens.offset[local_29c]) + local_284;
    local_288 = (in_RDI->freqs).offset[local_29c] * (""[local_29c] + 5) + local_288;
  }
  uVar2 = (-(local_26c + 3) & 7) + ((in_ECX + 0xfffe) / 0xffff - 1) * 0x28 + in_ECX * 8 + 0x23;
  local_360 = uVar2;
  if (local_288 <= uVar2) {
    local_360 = local_288;
  }
  if (local_360 < local_284) {
    local_368 = uVar2;
    if (local_288 <= uVar2) {
      local_368 = local_288;
    }
    local_364 = local_368;
  }
  else {
    local_364 = local_284;
  }
  if ((long)(in_RSI[3] - (long)local_278) < (long)(ulong)(local_26c + local_364 + 7 >> 3)) {
    *(undefined1 *)(in_RSI + 4) = 1;
  }
  else {
    local_258 = in_RDX;
    if (local_364 == uVar2) {
      do {
        local_2a9 = 0;
        local_2b8 = 0xffff;
        if ((long)pbVar8 - (long)local_258 < 0x10000) {
          local_2b8 = (long)pbVar8 - (long)local_258;
          local_2a9 = bVar1;
        }
        *(byte *)local_278 = local_2a9 << ((byte)local_26c & 0x1f) | (byte)local_268;
        puVar9 = (ulong *)((long)local_278 + 1);
        if (5 < local_26c) {
          *(undefined1 *)((long)local_278 + 1) = 0;
          puVar9 = (ulong *)((long)local_278 + 2);
        }
        local_278 = puVar9;
        local_268 = 0;
        local_26c = 0;
        *(ushort *)local_278 = (ushort)local_2b8;
        *(ushort *)((long)local_278 + 2) = (ushort)local_2b8 ^ 0xffff;
        memcpy((ushort *)((long)local_278 + 4),local_258,local_2b8);
        local_278 = (ulong *)(local_2b8 + (long)local_278 + 4);
        local_258 = local_258 + local_2b8;
      } while (local_258 != pbVar8);
    }
    else {
      bVar10 = (byte)local_26c;
      if (local_364 == local_288) {
        local_298 = &in_RDI->static_codes;
        local_268 = 1L << (bVar10 + 1 & 0x3f) | (ulong)bVar1 << (bVar10 & 0x3f) | local_268;
        local_26c = local_26c + 3;
        if (local_278 < puVar9) {
          *local_278 = local_268;
          local_268 = local_268 >> ((byte)local_26c & 0x38);
          local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
          local_26c = local_26c & 7;
        }
        else {
          for (; 7 < local_26c; local_26c = local_26c - 8) {
            *(byte *)local_278 = (byte)local_268;
            local_268 = local_268 >> 8;
            local_278 = (ulong *)((long)local_278 + 1);
          }
        }
      }
      else {
        uVar2 = (in_RDI->o).precode.num_explicit_lens;
        uVar4 = (in_RDI->o).precode.num_items;
        local_298 = &in_RDI->codes;
        local_268 = (ulong)(in_RDI->o).precode.lens[0x10] << (bVar10 + 0x11 & 0x3f) |
                    (ulong)(uVar2 - 4) << (bVar10 + 0xd & 0x3f) |
                    (ulong)((in_RDI->o).precode.num_offset_syms - 1) << (bVar10 + 8 & 0x3f) |
                    (ulong)((in_RDI->o).precode.num_litlen_syms - 0x101) << (bVar10 + 3 & 0x3f) |
                    2L << (bVar10 + 1 & 0x3f) | (ulong)bVar1 << (bVar10 & 0x3f) | local_268;
        local_26c = local_26c + 0x14;
        if (local_278 < puVar9) {
          *local_278 = local_268;
          local_268 = local_268 >> ((byte)local_26c & 0x38);
          local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
          local_26c = local_26c & 7;
        }
        else {
          for (; 7 < local_26c; local_26c = local_26c - 8) {
            *(byte *)local_278 = (byte)local_268;
            local_268 = local_268 >> 8;
            local_278 = (ulong *)((long)local_278 + 1);
          }
        }
        local_2cc = 1;
        do {
          local_268 = (ulong)*(byte *)((long)&in_RDI->o + (ulong)"\x10\x11\x12"[local_2cc] + 0x98)
                      << ((byte)local_26c & 0x3f) | local_268;
          local_26c = local_26c + 3;
          local_2cc = local_2cc + 1;
        } while (local_2cc < uVar2);
        if (local_278 < puVar9) {
          *local_278 = local_268;
          local_268 = local_268 >> ((byte)local_26c & 0x38);
          local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
          local_26c = local_26c & 7;
        }
        else {
          for (; 7 < local_26c; local_26c = local_26c - 8) {
            *(byte *)local_278 = (byte)local_268;
            local_268 = local_268 >> 8;
            local_278 = (ulong *)((long)local_278 + 1);
          }
        }
        local_2cc = 0;
        do {
          uVar2 = *(uint *)((long)&in_RDI->o + (ulong)local_2cc * 4 + 0xac);
          uVar3 = uVar2 & 0x1f;
          iVar5 = *(byte *)((long)&in_RDI->o + (ulong)uVar3 + 0x98) + local_26c;
          local_268 = (ulong)(uVar2 >> 5) << ((byte)iVar5 & 0x3f) |
                      (ulong)*(uint *)((long)&in_RDI->o + (ulong)uVar3 * 4 + 0x4c) <<
                      ((byte)local_26c & 0x3f) | local_268;
          local_26c = (uint)""[uVar3] + iVar5;
          if (local_278 < puVar9) {
            *local_278 = local_268;
            local_268 = local_268 >> ((byte)local_26c & 0x38);
            local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
            local_26c = local_26c & 7;
          }
          else {
            for (; 7 < local_26c; local_26c = local_26c - 8) {
              *(byte *)local_278 = (byte)local_268;
              local_268 = local_268 >> 8;
              local_278 = (ulong *)((long)local_278 + 1);
            }
          }
          local_2cc = local_2cc + 1;
        } while (local_2cc < uVar4);
      }
      deflate_compute_full_len_codewords(in_RDI,local_298);
      local_310 = in_R8;
      if (in_R8 == (uint *)0x0) {
        local_2d8 = (undefined1 *)((long)&in_RDI->p + 0x639584);
        do {
          uVar2 = *(uint *)(local_2d8 + 4) & 0x1ff;
          uVar4 = *(uint *)(local_2d8 + 4) >> 9;
          if (uVar2 == 1) {
            local_268 = (ulong)(local_298->codewords).litlen[uVar4] << ((byte)local_26c & 0x3f) |
                        local_268;
            local_26c = (local_298->lens).litlen[uVar4] + local_26c;
            if (local_278 < puVar9) {
              *local_278 = local_268;
              local_268 = local_268 >> ((byte)local_26c & 0x38);
              local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
              local_26c = local_26c & 7;
            }
            else {
              for (; 7 < local_26c; local_26c = local_26c - 8) {
                *(byte *)local_278 = (byte)local_268;
                local_268 = local_268 >> 8;
                local_278 = (ulong *)((long)local_278 + 1);
              }
            }
          }
          else {
            uVar3 = (uint)*(byte *)((long)&in_RDI->p + (ulong)uVar4 + 0x88e1dc);
            iVar5 = *(byte *)((long)&in_RDI->o + (ulong)uVar2 + 0x40c) + local_26c;
            iVar6 = (uint)(local_298->lens).offset[uVar3] + iVar5;
            local_268 = (ulong)(uVar4 - deflate_offset_slot_base[uVar3]) << ((byte)iVar6 & 0x3f) |
                        (ulong)(local_298->codewords).offset[uVar3] << ((byte)iVar5 & 0x3f) |
                        (ulong)*(uint *)((long)&in_RDI->o + (ulong)uVar2 * 4) <<
                        ((byte)local_26c & 0x3f) | local_268;
            local_26c = (uint)""[uVar3] + iVar6;
            if (local_278 < puVar9) {
              *local_278 = local_268;
              local_268 = local_268 >> ((byte)local_26c & 0x38);
              local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
              local_26c = local_26c & 7;
            }
            else {
              for (; 7 < local_26c; local_26c = local_26c - 8) {
                *(byte *)local_278 = (byte)local_268;
                local_268 = local_268 >> 8;
                local_278 = (ulong *)((long)local_278 + 1);
              }
            }
          }
          local_2d8 = local_2d8 + (ulong)uVar2 * 8;
        } while (local_2d8 != (undefined1 *)((long)&in_RDI->p + (ulong)in_ECX * 8 + 0x639584));
      }
      else {
        while( true ) {
          uVar2 = *local_310 >> 0x17;
          for (local_314 = *local_310 & 0x7fffff; 3 < local_314; local_314 = local_314 - 4) {
            pbVar8 = local_258 + 1;
            bVar1 = *local_258;
            iVar5 = (local_298->lens).litlen[(uint)bVar1] + local_26c;
            pbVar11 = local_258 + 2;
            iVar6 = (uint)(local_298->lens).litlen[(uint)*pbVar8] + iVar5;
            pbVar12 = local_258 + 3;
            iVar7 = (uint)(local_298->lens).litlen[(uint)*pbVar11] + iVar6;
            local_258 = local_258 + 4;
            local_268 = (ulong)(local_298->codewords).litlen[(uint)*pbVar12] << ((byte)iVar7 & 0x3f)
                        | (ulong)(local_298->codewords).litlen[(uint)*pbVar11] <<
                          ((byte)iVar6 & 0x3f) |
                          (ulong)(local_298->codewords).litlen[(uint)*pbVar8] <<
                          ((byte)iVar5 & 0x3f) |
                          (ulong)(local_298->codewords).litlen[(uint)bVar1] <<
                          ((byte)local_26c & 0x3f) | local_268;
            local_26c = (uint)(local_298->lens).litlen[(uint)*pbVar12] + iVar7;
            if (local_278 < puVar9) {
              *local_278 = local_268;
              local_268 = local_268 >> ((byte)local_26c & 0x38);
              local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
              local_26c = local_26c & 7;
            }
            else {
              for (; 7 < local_26c; local_26c = local_26c - 8) {
                *(byte *)local_278 = (byte)local_268;
                local_268 = local_268 >> 8;
                local_278 = (ulong *)((long)local_278 + 1);
              }
            }
          }
          if (local_314 != 0) {
            local_268 = (ulong)(local_298->codewords).litlen[(uint)*local_258] <<
                        ((byte)local_26c & 0x3f) | local_268;
            local_26c = (local_298->lens).litlen[(uint)*local_258] + local_26c;
            pbVar8 = local_258 + 1;
            if (local_314 != 1) {
              uVar4 = (uint)local_258[1];
              local_268 = (ulong)(local_298->codewords).litlen[uVar4] << ((byte)local_26c & 0x3f) |
                          local_268;
              local_26c = (local_298->lens).litlen[uVar4] + local_26c;
              pbVar8 = local_258 + 2;
              if (local_314 != 2) {
                uVar4 = (uint)local_258[2];
                local_268 = (ulong)(local_298->codewords).litlen[uVar4] << ((byte)local_26c & 0x3f)
                            | local_268;
                local_26c = (local_298->lens).litlen[uVar4] + local_26c;
                pbVar8 = local_258 + 3;
              }
            }
            local_258 = pbVar8;
            if (local_278 < puVar9) {
              *local_278 = local_268;
              local_268 = local_268 >> ((byte)local_26c & 0x38);
              local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
              local_26c = local_26c & 7;
            }
            else {
              for (; 7 < local_26c; local_26c = local_26c - 8) {
                *(byte *)local_278 = (byte)local_268;
                local_268 = local_268 >> 8;
                local_278 = (ulong *)((long)local_278 + 1);
              }
            }
          }
          if (uVar2 == 0) break;
          uVar4 = (uint)*(ushort *)((long)local_310 + 6);
          iVar5 = *(byte *)((long)&in_RDI->o + (ulong)uVar2 + 0x40c) + local_26c;
          iVar6 = (uint)(local_298->lens).offset[uVar4] + iVar5;
          local_268 = (ulong)((uint)(ushort)local_310[1] - deflate_offset_slot_base[uVar4]) <<
                      ((byte)iVar6 & 0x3f) |
                      (ulong)(local_298->codewords).offset[uVar4] << ((byte)iVar5 & 0x3f) |
                      (ulong)*(uint *)((long)&in_RDI->o + (ulong)uVar2 * 4) <<
                      ((byte)local_26c & 0x3f) | local_268;
          local_26c = (uint)""[uVar4] + iVar6;
          if (local_278 < puVar9) {
            *local_278 = local_268;
            local_268 = local_268 >> ((byte)local_26c & 0x38);
            local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
            local_26c = local_26c & 7;
          }
          else {
            for (; 7 < local_26c; local_26c = local_26c - 8) {
              *(byte *)local_278 = (byte)local_268;
              local_268 = local_268 >> 8;
              local_278 = (ulong *)((long)local_278 + 1);
            }
          }
          local_258 = local_258 + uVar2;
          local_310 = local_310 + 2;
        }
      }
      local_268 = (ulong)(local_298->codewords).litlen[0x100] << ((byte)local_26c & 0x3f) |
                  local_268;
      local_26c = (local_298->lens).litlen[0x100] + local_26c;
      if (local_278 < puVar9) {
        *local_278 = local_268;
        local_268 = local_268 >> ((byte)local_26c & 0x38);
        local_278 = (ulong *)((long)local_278 + (ulong)(local_26c >> 3));
        local_26c = local_26c & 7;
      }
      else {
        for (; 7 < local_26c; local_26c = local_26c - 8) {
          *(byte *)local_278 = (byte)local_268;
          local_268 = local_268 >> 8;
          local_278 = (ulong *)((long)local_278 + 1);
        }
      }
    }
    *in_RSI = local_268;
    *(uint *)(in_RSI + 1) = local_26c;
    in_RSI[2] = (ulong)local_278;
  }
  return;
}

Assistant:

void
deflate_flush_block(struct libdeflate_compressor *c,
		    struct deflate_output_bitstream *os,
		    const u8 *block_begin, u32 block_length,
		    const struct deflate_sequence *sequences,
		    bool is_final_block)
{
	/*
	 * It is hard to get compilers to understand that writes to 'os->next'
	 * don't alias 'os'.  That hurts performance significantly, as
	 * everything in 'os' would keep getting re-loaded.  ('restrict'
	 * *should* do the trick, but it's unreliable.)  Therefore, we keep all
	 * the output bitstream state in local variables, and output bits using
	 * macros.  This is similar to what the decompressor does.
	 */
	const u8 *in_next = block_begin;
	const u8 * const in_end = block_begin + block_length;
	bitbuf_t bitbuf = os->bitbuf;
	unsigned bitcount = os->bitcount;
	u8 *out_next = os->next;
	u8 * const out_fast_end =
		os->end - MIN(WORDBYTES - 1, os->end - out_next);
	/*
	 * The cost for each block type, in bits.  Start with the cost of the
	 * block header which is 3 bits.
	 */
	u32 dynamic_cost = 3;
	u32 static_cost = 3;
	u32 uncompressed_cost = 3;
	u32 best_cost;
	struct deflate_codes *codes;
	unsigned sym;

	ASSERT(block_length >= MIN_BLOCK_LENGTH ||
	       (is_final_block && block_length > 0));
	ASSERT(block_length <= MAX_BLOCK_LENGTH);
	ASSERT(bitcount <= 7);
	ASSERT((bitbuf & ~(((bitbuf_t)1 << bitcount) - 1)) == 0);
	ASSERT(out_next <= os->end);
	ASSERT(!os->overflow);

	/* Precompute the precode items and build the precode. */
	deflate_precompute_huffman_header(c);

	/* Account for the cost of encoding dynamic Huffman codes. */
	dynamic_cost += 5 + 5 + 4 + (3 * c->o.precode.num_explicit_lens);
	for (sym = 0; sym < DEFLATE_NUM_PRECODE_SYMS; sym++) {
		u32 extra = deflate_extra_precode_bits[sym];

		dynamic_cost += c->o.precode.freqs[sym] *
				(extra + c->o.precode.lens[sym]);
	}

	/* Account for the cost of encoding literals. */
	for (sym = 0; sym < 144; sym++) {
		dynamic_cost += c->freqs.litlen[sym] *
				c->codes.lens.litlen[sym];
		static_cost += c->freqs.litlen[sym] * 8;
	}
	for (; sym < 256; sym++) {
		dynamic_cost += c->freqs.litlen[sym] *
				c->codes.lens.litlen[sym];
		static_cost += c->freqs.litlen[sym] * 9;
	}

	/* Account for the cost of encoding the end-of-block symbol. */
	dynamic_cost += c->codes.lens.litlen[DEFLATE_END_OF_BLOCK];
	static_cost += 7;

	/* Account for the cost of encoding lengths. */
	for (sym = DEFLATE_FIRST_LEN_SYM;
	     sym < DEFLATE_FIRST_LEN_SYM + ARRAY_LEN(deflate_extra_length_bits);
	     sym++) {
		u32 extra = deflate_extra_length_bits[
					sym - DEFLATE_FIRST_LEN_SYM];

		dynamic_cost += c->freqs.litlen[sym] *
				(extra + c->codes.lens.litlen[sym]);
		static_cost += c->freqs.litlen[sym] *
				(extra + c->static_codes.lens.litlen[sym]);
	}

	/* Account for the cost of encoding offsets. */
	for (sym = 0; sym < ARRAY_LEN(deflate_extra_offset_bits); sym++) {
		u32 extra = deflate_extra_offset_bits[sym];

		dynamic_cost += c->freqs.offset[sym] *
				(extra + c->codes.lens.offset[sym]);
		static_cost += c->freqs.offset[sym] * (extra + 5);
	}

	/* Compute the cost of using uncompressed blocks. */
	uncompressed_cost += (-(bitcount + 3) & 7) + 32 +
			     (40 * (DIV_ROUND_UP(block_length,
						 UINT16_MAX) - 1)) +
			     (8 * block_length);

	/*
	 * Choose and output the cheapest type of block.  If there is a tie,
	 * prefer uncompressed, then static, then dynamic.
	 */

	best_cost = MIN(dynamic_cost, MIN(static_cost, uncompressed_cost));

	/* If the block isn't going to fit, then stop early. */
	if (DIV_ROUND_UP(bitcount + best_cost, 8) > os->end - out_next) {
		os->overflow = true;
		return;
	}
	/*
	 * Else, now we know that the block fits, so no further bounds checks on
	 * the output buffer are required until the next block.
	 */

	if (best_cost == uncompressed_cost) {
		/*
		 * Uncompressed block(s).  DEFLATE limits the length of
		 * uncompressed blocks to UINT16_MAX bytes, so if the length of
		 * the "block" we're flushing is over UINT16_MAX, we actually
		 * output multiple blocks.
		 */
		do {
			u8 bfinal = 0;
			size_t len = UINT16_MAX;

			if (in_end - in_next <= UINT16_MAX) {
				bfinal = is_final_block;
				len = in_end - in_next;
			}
			/* It was already checked that there is enough space. */
			ASSERT(os->end - out_next >=
			       DIV_ROUND_UP(bitcount + 3, 8) + 4 + len);
			/*
			 * Output BFINAL (1 bit) and BTYPE (2 bits), then align
			 * to a byte boundary.
			 */
			STATIC_ASSERT(DEFLATE_BLOCKTYPE_UNCOMPRESSED == 0);
			*out_next++ = (bfinal << bitcount) | bitbuf;
			if (bitcount > 5)
				*out_next++ = 0;
			bitbuf = 0;
			bitcount = 0;
			/* Output LEN and NLEN, then the data itself. */
			put_unaligned_le16(len, out_next);
			out_next += 2;
			put_unaligned_le16(~len, out_next);
			out_next += 2;
			memcpy(out_next, in_next, len);
			out_next += len;
			in_next += len;
		} while (in_next != in_end);
		/* Done outputting uncompressed block(s) */
		goto out;
	}

	if (best_cost == static_cost) {
		/* Static Huffman block */
		codes = &c->static_codes;
		ADD_BITS(is_final_block, 1);
		ADD_BITS(DEFLATE_BLOCKTYPE_STATIC_HUFFMAN, 2);
		FLUSH_BITS();
	} else {
		const unsigned num_explicit_lens = c->o.precode.num_explicit_lens;
		const unsigned num_precode_items = c->o.precode.num_items;
		unsigned precode_sym, precode_item;
		unsigned i;

		/* Dynamic Huffman block */

		codes = &c->codes;
		STATIC_ASSERT(CAN_BUFFER(1 + 2 + 5 + 5 + 4 + 3));
		ADD_BITS(is_final_block, 1);
		ADD_BITS(DEFLATE_BLOCKTYPE_DYNAMIC_HUFFMAN, 2);
		ADD_BITS(c->o.precode.num_litlen_syms - 257, 5);
		ADD_BITS(c->o.precode.num_offset_syms - 1, 5);
		ADD_BITS(num_explicit_lens - 4, 4);

		/* Output the lengths of the codewords in the precode. */
		if (CAN_BUFFER(3 * (DEFLATE_NUM_PRECODE_SYMS - 1))) {
			/*
			 * A 64-bit bitbuffer is just one bit too small to hold
			 * the maximum number of precode lens, so to minimize
			 * flushes we merge one len with the previous fields.
			 */
			precode_sym = deflate_precode_lens_permutation[0];
			ADD_BITS(c->o.precode.lens[precode_sym], 3);
			FLUSH_BITS();
			i = 1; /* num_explicit_lens >= 4 */
			do {
				precode_sym =
					deflate_precode_lens_permutation[i];
				ADD_BITS(c->o.precode.lens[precode_sym], 3);
			} while (++i < num_explicit_lens);
			FLUSH_BITS();
		} else {
			FLUSH_BITS();
			i = 0;
			do {
				precode_sym =
					deflate_precode_lens_permutation[i];
				ADD_BITS(c->o.precode.lens[precode_sym], 3);
				FLUSH_BITS();
			} while (++i < num_explicit_lens);
		}

		/*
		 * Output the lengths of the codewords in the litlen and offset
		 * codes, encoded by the precode.
		 */
		i = 0;
		do {
			precode_item = c->o.precode.items[i];
			precode_sym = precode_item & 0x1F;
			STATIC_ASSERT(CAN_BUFFER(MAX_PRE_CODEWORD_LEN + 7));
			ADD_BITS(c->o.precode.codewords[precode_sym],
				 c->o.precode.lens[precode_sym]);
			ADD_BITS(precode_item >> 5,
				 deflate_extra_precode_bits[precode_sym]);
			FLUSH_BITS();
		} while (++i < num_precode_items);
	}

	/* Output the literals and matches for a dynamic or static block. */
	ASSERT(bitcount <= 7);
	deflate_compute_full_len_codewords(c, codes);
#if SUPPORT_NEAR_OPTIMAL_PARSING
	if (sequences == NULL) {
		/* Output the literals and matches from the minimum-cost path */
		struct deflate_optimum_node *cur_node =
			&c->p.n.optimum_nodes[0];
		struct deflate_optimum_node * const end_node =
			&c->p.n.optimum_nodes[block_length];
		do {
			u32 length = cur_node->item & OPTIMUM_LEN_MASK;
			u32 offset = cur_node->item >> OPTIMUM_OFFSET_SHIFT;

			if (length == 1) {
				/* Literal */
				ADD_BITS(codes->codewords.litlen[offset],
					 codes->lens.litlen[offset]);
				FLUSH_BITS();
			} else {
				/* Match */
				WRITE_MATCH(c, codes, length, offset,
					    c->p.n.offset_slot_full[offset]);
			}
			cur_node += length;
		} while (cur_node != end_node);
	} else
#endif /* SUPPORT_NEAR_OPTIMAL_PARSING */
	{
		/* Output the literals and matches from the sequences list. */
		const struct deflate_sequence *seq;

		for (seq = sequences; ; seq++) {
			u32 litrunlen = seq->litrunlen_and_length &
					SEQ_LITRUNLEN_MASK;
			u32 length = seq->litrunlen_and_length >>
				     SEQ_LENGTH_SHIFT;
			unsigned lit;

			/* Output a run of literals. */
			if (CAN_BUFFER(4 * MAX_LITLEN_CODEWORD_LEN)) {
				for (; litrunlen >= 4; litrunlen -= 4) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					FLUSH_BITS();
				}
				if (litrunlen-- != 0) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					if (litrunlen-- != 0) {
						lit = *in_next++;
						ADD_BITS(codes->codewords.litlen[lit],
							 codes->lens.litlen[lit]);
						if (litrunlen-- != 0) {
							lit = *in_next++;
							ADD_BITS(codes->codewords.litlen[lit],
								 codes->lens.litlen[lit]);
						}
					}
					FLUSH_BITS();
				}
			} else {
				while (litrunlen--) {
					lit = *in_next++;
					ADD_BITS(codes->codewords.litlen[lit],
						 codes->lens.litlen[lit]);
					FLUSH_BITS();
				}
			}

			if (length == 0) { /* Last sequence? */
				ASSERT(in_next == in_end);
				break;
			}

			/* Output a match. */
			WRITE_MATCH(c, codes, length, seq->offset,
				    seq->offset_slot);
			in_next += length;
		}
	}

	/* Output the end-of-block symbol. */
	ASSERT(bitcount <= 7);
	ADD_BITS(codes->codewords.litlen[DEFLATE_END_OF_BLOCK],
		 codes->lens.litlen[DEFLATE_END_OF_BLOCK]);
	FLUSH_BITS();
out:
	ASSERT(bitcount <= 7);
	/*
	 * Assert that the block cost was computed correctly.  This is relied on
	 * above for the bounds check on the output buffer.  Also,
	 * libdeflate_deflate_compress_bound() relies on this via the assumption
	 * that uncompressed blocks will always be used when cheapest.
	 */
	ASSERT(8 * (out_next - os->next) + bitcount - os->bitcount == best_cost);
	os->bitbuf = bitbuf;
	os->bitcount = bitcount;
	os->next = out_next;
}